

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cpp
# Opt level: O1

shared_ptr<index_tree> __thiscall dfa::create_index_tree(dfa *this,wchar_t key)

{
  long *plVar1;
  size_type sVar2;
  long lVar3;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  undefined4 in_register_00000034;
  _Hashtable<wchar_t,std::pair<wchar_t_const,std::shared_ptr<index_tree>>,std::allocator<std::pair<wchar_t_const,std::shared_ptr<index_tree>>>,std::__detail::_Select1st,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var6;
  long *plVar7;
  long *plVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_false,_false>,_bool>
  pVar9;
  shared_ptr<index_tree> sVar10;
  undefined1 local_1d;
  undefined1 local_1c [4];
  
  p_Var6 = (_Hashtable<wchar_t,std::pair<wchar_t_const,std::shared_ptr<index_tree>>,std::allocator<std::pair<wchar_t_const,std::shared_ptr<index_tree>>>,std::__detail::_Select1st,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            *)CONCAT44(in_register_00000034,key);
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((ulong)(long)in_EDX % *(ulong *)(p_Var6 + 8));
  plVar7 = *(long **)(*(long *)p_Var6 + (long)p_Var4 * 8);
  _Var5._M_pi = p_Var4;
  plVar8 = (long *)0x0;
  if ((plVar7 != (long *)0x0) &&
     (plVar1 = (long *)*plVar7, plVar8 = plVar7, *(int *)((long *)*plVar7 + 1) != in_EDX)) {
    while (plVar7 = plVar1, plVar1 = (long *)*plVar7, plVar1 != (long *)0x0) {
      _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((ulong)(long)(int)plVar1[1] % *(ulong *)(p_Var6 + 8));
      plVar8 = (long *)0x0;
      if ((_Var5._M_pi != p_Var4) || (plVar8 = plVar7, (int)plVar1[1] == in_EDX)) goto LAB_0010662b;
    }
    plVar8 = (long *)0x0;
  }
LAB_0010662b:
  if (plVar8 == (long *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = *plVar8;
  }
  if (lVar3 == 0) {
    (this->index_trees_)._M_h._M_buckets = (__buckets_ptr)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<index_tree,std::allocator<index_tree>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->index_trees_)._M_h._M_bucket_count,(index_tree **)this,
               (allocator<index_tree> *)&local_1d);
    pVar9 = std::
            _Hashtable<wchar_t,std::pair<wchar_t_const,std::shared_ptr<index_tree>>,std::allocator<std::pair<wchar_t_const,std::shared_ptr<index_tree>>>,std::__detail::_Select1st,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<wchar_t&,std::shared_ptr<index_tree>&>(p_Var6,local_1c,this);
    _Var5._M_pi = pVar9._8_8_;
  }
  else {
    (this->index_trees_)._M_h._M_buckets = *(__buckets_ptr *)(lVar3 + 0x10);
    sVar2 = *(size_type *)(lVar3 + 0x18);
    (this->index_trees_)._M_h._M_bucket_count = sVar2;
    if (sVar2 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(sVar2 + 8) = *(int *)(sVar2 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(sVar2 + 8) = *(int *)(sVar2 + 8) + 1;
      }
    }
  }
  sVar10.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  sVar10.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<index_tree>)sVar10.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<index_tree> dfa::create_index_tree(wchar_t key)
{
    auto iter = index_trees_.find(key);
    if (iter == index_trees_.end())
    {
        auto tree = std::make_shared<index_tree>();
        index_trees_.emplace(key, tree);
        return tree;
    }
    return iter->second;
}